

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector1.cpp
# Opt level: O2

void embree::sse42::
     BVHNIntersector1<4,_1,_true,_embree::sse42::ArrayIntersector1<embree::sse42::TriangleMiIntersector1Pluecker<4,_true>_>_>
     ::intersect(Intersectors *This,RayHit *ray,RayQueryContext *context)

{
  float *pfVar1;
  float *pfVar2;
  float *pfVar3;
  float *pfVar4;
  float *pfVar5;
  float *pfVar6;
  float *pfVar7;
  float *pfVar8;
  float *pfVar9;
  undefined8 *puVar10;
  anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1 aVar11;
  uint uVar12;
  uint uVar13;
  float **ppfVar14;
  float *pfVar15;
  float *pfVar16;
  float *pfVar17;
  float *pfVar18;
  Geometry *pGVar19;
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  uint uVar24;
  int iVar25;
  undefined1 (*pauVar26) [16];
  long lVar27;
  undefined8 uVar28;
  undefined4 uVar29;
  RTCIntersectArguments *pRVar30;
  ulong uVar31;
  ulong uVar32;
  Scene *pSVar33;
  ulong uVar34;
  ulong uVar35;
  undefined1 (*pauVar36) [16];
  ulong uVar37;
  undefined1 (*pauVar38) [16];
  ulong uVar39;
  ulong uVar40;
  float fVar41;
  float fVar59;
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  float fVar65;
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  float fVar66;
  float fVar67;
  float fVar73;
  float fVar75;
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  float fVar74;
  float fVar76;
  float fVar77;
  undefined1 auVar72 [16];
  float fVar78;
  float fVar84;
  float fVar85;
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  float fVar86;
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  float fVar93;
  float fVar97;
  float fVar98;
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  float fVar101;
  float fVar102;
  float fVar103;
  float fVar104;
  float fVar105;
  float fVar106;
  float fVar107;
  float fVar108;
  float fVar109;
  float fVar110;
  float fVar113;
  float fVar114;
  float fVar115;
  float fVar116;
  float fVar117;
  float fVar118;
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  float fVar119;
  float fVar120;
  float fVar121;
  float fVar123;
  float fVar124;
  float fVar125;
  float fVar126;
  float fVar127;
  undefined1 auVar122 [16];
  float fVar128;
  float fVar130;
  float fVar131;
  float fVar132;
  undefined1 auVar129 [16];
  float fVar133;
  float fVar134;
  float fVar135;
  float fVar136;
  float fVar137;
  float fVar139;
  float fVar140;
  float fVar141;
  undefined1 auVar138 [16];
  UVIdentity<4> mapUV;
  vbool<4> valid;
  RTCFilterFunctionNArguments args;
  HitK<1> h;
  vfloat<4> tNear;
  StackItemT<embree::NodeRefPtr<4>_> stack [244];
  undefined1 local_1269;
  ulong local_1268;
  ulong local_1260;
  Scene *local_1258;
  int local_124c;
  undefined1 local_1248 [8];
  float fStack_1240;
  float fStack_123c;
  undefined1 local_1238 [8];
  float fStack_1230;
  float fStack_122c;
  undefined8 local_1228;
  float fStack_1220;
  float fStack_121c;
  undefined1 local_1218 [16];
  undefined1 local_1208 [16];
  ulong local_11f0;
  RayHit *local_11e8;
  RayQueryContext *local_11e0;
  float local_11d8;
  float fStack_11d4;
  float fStack_11d0;
  float fStack_11cc;
  undefined1 local_11c8 [8];
  float fStack_11c0;
  float fStack_11bc;
  long local_11b8;
  long local_11b0;
  RTCFilterFunctionNArguments local_11a8;
  float local_1178;
  undefined4 local_1174;
  undefined4 local_1170;
  undefined4 local_116c;
  undefined4 local_1168;
  undefined4 local_1164;
  uint local_1160;
  uint local_115c;
  uint local_1158;
  float local_1148;
  float fStack_1144;
  float fStack_1140;
  float fStack_113c;
  float local_1138;
  float fStack_1134;
  float fStack_1130;
  float fStack_112c;
  undefined8 local_1128;
  undefined8 uStack_1120;
  undefined1 local_1118 [12];
  float fStack_110c;
  float local_1108;
  float fStack_1104;
  float fStack_1100;
  float fStack_10fc;
  undefined1 local_10f8 [16];
  undefined1 *local_10e8;
  undefined1 local_10d8 [16];
  undefined1 local_10c8 [16];
  undefined1 local_10b8 [16];
  undefined1 local_10a8 [16];
  undefined1 local_1098 [16];
  undefined1 local_1088 [16];
  undefined1 local_1078 [16];
  uint local_1068;
  uint uStack_1064;
  uint uStack_1060;
  uint uStack_105c;
  float local_1058;
  float fStack_1054;
  float fStack_1050;
  float fStack_104c;
  float local_1048;
  float fStack_1044;
  float fStack_1040;
  float fStack_103c;
  float local_1038;
  float fStack_1034;
  float fStack_1030;
  float fStack_102c;
  float local_1028;
  float fStack_1024;
  float fStack_1020;
  float fStack_101c;
  float local_1018;
  float fStack_1014;
  float fStack_1010;
  float fStack_100c;
  float local_1008;
  float fStack_1004;
  float fStack_1000;
  float fStack_ffc;
  float local_ff8;
  float fStack_ff4;
  float fStack_ff0;
  float fStack_fec;
  float local_fe8;
  float fStack_fe4;
  float fStack_fe0;
  float fStack_fdc;
  undefined1 local_fd8 [16];
  float local_fc8;
  float fStack_fc4;
  float fStack_fc0;
  float fStack_fbc;
  float local_fb8;
  float fStack_fb4;
  float fStack_fb0;
  float fStack_fac;
  float local_fa8;
  float fStack_fa4;
  float fStack_fa0;
  float fStack_f9c;
  float local_f98;
  float fStack_f94;
  float fStack_f90;
  float fStack_f8c;
  undefined8 local_f88;
  undefined8 uStack_f80;
  long local_f78;
  undefined4 uStack_f70;
  undefined1 local_f68 [3896];
  undefined1 auVar50 [16];
  
  local_f78 = *(long *)&This->ptr[1].bounds.bounds0.lower.field_0;
  if (local_f78 != 8) {
    pauVar36 = (undefined1 (*) [16])local_f68;
    uStack_f70 = 0;
    fVar127 = (ray->super_RayK<1>).org.field_0.m128[0];
    fVar65 = (ray->super_RayK<1>).org.field_0.m128[1];
    fVar41 = (ray->super_RayK<1>).org.field_0.m128[2];
    fVar59 = *(float *)((long)&(ray->super_RayK<1>).org.field_0 + 0xc);
    aVar11 = (ray->super_RayK<1>).dir.field_0.field_1;
    fVar136 = (ray->super_RayK<1>).tfar;
    fVar86 = 0.0;
    if (0.0 <= fVar136) {
      fVar86 = fVar136;
    }
    auVar112._4_4_ = -(uint)(ABS(aVar11.y) < 1e-18);
    auVar112._0_4_ = -(uint)(ABS(aVar11.x) < 1e-18);
    auVar112._8_4_ = -(uint)(ABS(aVar11.z) < 1e-18);
    auVar112._12_4_ = -(uint)(ABS(aVar11.field_3.w) < 1e-18);
    fVar136 = 0.0;
    if (0.0 <= fVar59) {
      fVar136 = fVar59;
    }
    auVar111 = divps(_DAT_01f46a60,(undefined1  [16])aVar11);
    auVar112 = blendvps(auVar111,_DAT_01f76a70,auVar112);
    fVar121 = auVar112._0_4_ * 0.99999964;
    fVar123 = auVar112._4_4_ * 0.99999964;
    fVar125 = auVar112._8_4_ * 0.99999964;
    fVar109 = auVar112._0_4_ * 1.0000004;
    fVar113 = auVar112._4_4_ * 1.0000004;
    fVar116 = auVar112._8_4_ * 1.0000004;
    uVar35 = (ulong)(fVar121 < 0.0) << 4;
    uVar34 = (ulong)(fVar123 < 0.0) << 4 | 0x20;
    uVar32 = (ulong)(fVar125 < 0.0) << 4 | 0x40;
    uVar37 = uVar35 ^ 0x10;
    uVar31 = uVar34 ^ 0x10;
    uVar40 = uVar32 ^ 0x10;
    auVar111._4_4_ = fVar86;
    auVar111._0_4_ = fVar86;
    auVar111._8_4_ = fVar86;
    auVar111._12_4_ = fVar86;
    _local_1068 = mm_lookupmask_ps._240_8_;
    _uStack_1060 = mm_lookupmask_ps._248_8_;
    local_11e0 = context;
    local_11e8 = ray;
    local_11f0 = uVar35;
    local_fe8 = fVar41;
    fStack_fe4 = fVar41;
    fStack_fe0 = fVar41;
    fStack_fdc = fVar41;
    local_ff8 = fVar136;
    fStack_ff4 = fVar136;
    fStack_ff0 = fVar136;
    fStack_fec = fVar136;
    local_1008 = fVar116;
    fStack_1004 = fVar116;
    fStack_1000 = fVar116;
    fStack_ffc = fVar116;
    local_1018 = fVar125;
    fStack_1014 = fVar125;
    fStack_1010 = fVar125;
    fStack_100c = fVar125;
    local_1028 = fVar127;
    fStack_1024 = fVar127;
    fStack_1020 = fVar127;
    fStack_101c = fVar127;
    local_1038 = fVar65;
    fStack_1034 = fVar65;
    fStack_1030 = fVar65;
    fStack_102c = fVar65;
    local_1048 = fVar121;
    fStack_1044 = fVar121;
    fStack_1040 = fVar121;
    fStack_103c = fVar121;
    local_1058 = fVar123;
    fStack_1054 = fVar123;
    fStack_1050 = fVar123;
    fStack_104c = fVar123;
    local_1138 = fVar109;
    fStack_1134 = fVar109;
    fStack_1130 = fVar109;
    fStack_112c = fVar109;
    local_1148 = fVar113;
    fStack_1144 = fVar113;
    fStack_1140 = fVar113;
    fStack_113c = fVar113;
    fVar86 = fVar41;
    fVar59 = fVar41;
    fVar66 = fVar41;
    fVar67 = fVar136;
    fVar73 = fVar136;
    fVar74 = fVar136;
    fVar75 = fVar65;
    fVar76 = fVar65;
    fVar77 = fVar65;
    fVar78 = fVar123;
    fVar84 = fVar123;
    fVar85 = fVar123;
    fVar93 = fVar109;
    fVar97 = fVar109;
    fVar98 = fVar109;
    fVar101 = fVar113;
    fVar102 = fVar113;
    fVar103 = fVar113;
    fVar104 = fVar116;
    fVar105 = fVar116;
    fVar106 = fVar116;
    fVar107 = fVar125;
    fVar108 = fVar125;
    fVar110 = fVar125;
    fVar114 = fVar127;
    fVar115 = fVar127;
    fVar117 = fVar127;
    fVar118 = fVar121;
    fVar119 = fVar121;
    fVar120 = fVar121;
    local_1268 = uVar34;
    local_1260 = uVar32;
LAB_00683834:
    if (pauVar36 != (undefined1 (*) [16])&local_f78) {
      pauVar26 = pauVar36 + -1;
      pauVar36 = pauVar36 + -1;
      pfVar9 = &(ray->super_RayK<1>).tfar;
      if (*(float *)((long)*pauVar26 + 8) < *pfVar9 || *(float *)((long)*pauVar26 + 8) == *pfVar9) {
        pauVar26 = (undefined1 (*) [16])&local_f78;
        pauVar38 = *(undefined1 (**) [16])*pauVar36;
        while (((ulong)pauVar38 & 8) == 0) {
          pfVar9 = (float *)((long)pauVar38[2] + uVar35);
          auVar89._0_4_ = (*pfVar9 - fVar127) * fVar121;
          auVar89._4_4_ = (pfVar9[1] - fVar114) * fVar118;
          auVar89._8_4_ = (pfVar9[2] - fVar115) * fVar119;
          auVar89._12_4_ = (pfVar9[3] - fVar117) * fVar120;
          pfVar9 = (float *)((long)pauVar38[2] + uVar34);
          auVar95._0_4_ = (*pfVar9 - fVar65) * fVar123;
          auVar95._4_4_ = (pfVar9[1] - fVar75) * fVar78;
          auVar95._8_4_ = (pfVar9[2] - fVar76) * fVar84;
          auVar95._12_4_ = (pfVar9[3] - fVar77) * fVar85;
          auVar112 = maxps(auVar89,auVar95);
          pfVar9 = (float *)((long)pauVar38[2] + uVar32);
          auVar68._0_4_ = (*pfVar9 - fVar41) * fVar125;
          auVar68._4_4_ = (pfVar9[1] - fVar86) * fVar107;
          auVar68._8_4_ = (pfVar9[2] - fVar59) * fVar108;
          auVar68._12_4_ = (pfVar9[3] - fVar66) * fVar110;
          auVar69._4_4_ = fVar67;
          auVar69._0_4_ = fVar136;
          auVar69._8_4_ = fVar73;
          auVar69._12_4_ = fVar74;
          auVar69 = maxps(auVar68,auVar69);
          _local_1118 = maxps(auVar112,auVar69);
          pfVar9 = (float *)((long)pauVar38[2] + uVar37);
          auVar70._0_4_ = (*pfVar9 - fVar127) * fVar109;
          auVar70._4_4_ = (pfVar9[1] - fVar114) * fVar93;
          auVar70._8_4_ = (pfVar9[2] - fVar115) * fVar97;
          auVar70._12_4_ = (pfVar9[3] - fVar117) * fVar98;
          pfVar9 = (float *)((long)pauVar38[2] + uVar31);
          auVar79._0_4_ = (*pfVar9 - fVar65) * fVar113;
          auVar79._4_4_ = (pfVar9[1] - fVar75) * fVar101;
          auVar79._8_4_ = (pfVar9[2] - fVar76) * fVar102;
          auVar79._12_4_ = (pfVar9[3] - fVar77) * fVar103;
          auVar112 = minps(auVar70,auVar79);
          pfVar9 = (float *)((long)pauVar38[2] + uVar40);
          auVar80._0_4_ = (*pfVar9 - fVar41) * fVar116;
          auVar80._4_4_ = (pfVar9[1] - fVar86) * fVar104;
          auVar80._8_4_ = (pfVar9[2] - fVar59) * fVar105;
          auVar80._12_4_ = (pfVar9[3] - fVar66) * fVar106;
          auVar69 = minps(auVar80,auVar111);
          auVar112 = minps(auVar112,auVar69);
          auVar91._4_4_ = -(uint)(local_1118._4_4_ <= auVar112._4_4_);
          auVar91._0_4_ = -(uint)(local_1118._0_4_ <= auVar112._0_4_);
          auVar91._8_4_ = -(uint)(local_1118._8_4_ <= auVar112._8_4_);
          auVar91._12_4_ = -(uint)(local_1118._12_4_ <= auVar112._12_4_);
          uVar24 = movmskps((int)pauVar26,auVar91);
          if (uVar24 == 0) goto LAB_00683834;
          uVar24 = uVar24 & 0xff;
          uVar39 = (ulong)pauVar38 & 0xfffffffffffffff0;
          lVar27 = 0;
          if (uVar24 != 0) {
            for (; (uVar24 >> lVar27 & 1) == 0; lVar27 = lVar27 + 1) {
            }
          }
          pauVar26 = *(undefined1 (**) [16])(uVar39 + lVar27 * 8);
          uVar24 = uVar24 - 1 & uVar24;
          pauVar38 = pauVar26;
          if (uVar24 != 0) {
            uVar12 = *(uint *)(local_1118 + lVar27 * 4);
            lVar27 = 0;
            if (uVar24 != 0) {
              for (; (uVar24 >> lVar27 & 1) == 0; lVar27 = lVar27 + 1) {
              }
            }
            pauVar38 = *(undefined1 (**) [16])(uVar39 + lVar27 * 8);
            uVar13 = *(uint *)(local_1118 + lVar27 * 4);
            uVar24 = uVar24 - 1 & uVar24;
            uVar32 = local_1260;
            uVar34 = local_1268;
            if (uVar24 == 0) {
              if (uVar12 < uVar13) {
                *(undefined1 (**) [16])*pauVar36 = pauVar38;
                *(uint *)((long)*pauVar36 + 8) = uVar13;
                pauVar36 = pauVar36 + 1;
                pauVar38 = pauVar26;
              }
              else {
                *(undefined1 (**) [16])*pauVar36 = pauVar26;
                *(uint *)((long)*pauVar36 + 8) = uVar12;
                pauVar26 = pauVar38;
                pauVar36 = pauVar36 + 1;
              }
            }
            else {
              auVar71._8_4_ = uVar12;
              auVar71._0_8_ = pauVar26;
              auVar71._12_4_ = 0;
              auVar87._8_4_ = uVar13;
              auVar87._0_8_ = pauVar38;
              auVar87._12_4_ = 0;
              lVar27 = 0;
              if (uVar24 != 0) {
                for (; (uVar24 >> lVar27 & 1) == 0; lVar27 = lVar27 + 1) {
                }
              }
              uVar28 = *(undefined8 *)(uVar39 + lVar27 * 8);
              iVar25 = *(int *)(local_1118 + lVar27 * 4);
              auVar81._8_4_ = iVar25;
              auVar81._0_8_ = uVar28;
              auVar81._12_4_ = 0;
              auVar42._8_4_ = -(uint)((int)uVar12 < (int)uVar13);
              uVar24 = uVar24 - 1 & uVar24;
              if (uVar24 == 0) {
                auVar42._4_4_ = auVar42._8_4_;
                auVar42._0_4_ = auVar42._8_4_;
                auVar42._12_4_ = auVar42._8_4_;
                auVar90._8_4_ = uVar13;
                auVar90._0_8_ = pauVar38;
                auVar90._12_4_ = 0;
                auVar69 = blendvps(auVar90,auVar71,auVar42);
                auVar112 = blendvps(auVar71,auVar87,auVar42);
                auVar43._8_4_ = -(uint)(auVar69._8_4_ < iVar25);
                auVar43._4_4_ = auVar43._8_4_;
                auVar43._0_4_ = auVar43._8_4_;
                auVar43._12_4_ = auVar43._8_4_;
                auVar88._8_4_ = iVar25;
                auVar88._0_8_ = uVar28;
                auVar88._12_4_ = 0;
                auVar89 = blendvps(auVar88,auVar69,auVar43);
                auVar91 = blendvps(auVar69,auVar81,auVar43);
                auVar44._8_4_ = -(uint)(auVar112._8_4_ < auVar91._8_4_);
                auVar44._4_4_ = auVar44._8_4_;
                auVar44._0_4_ = auVar44._8_4_;
                auVar44._12_4_ = auVar44._8_4_;
                auVar69 = blendvps(auVar91,auVar112,auVar44);
                auVar112 = blendvps(auVar112,auVar91,auVar44);
                *pauVar36 = auVar112;
                pauVar36[1] = auVar69;
                pauVar26 = auVar89._0_8_;
                pauVar36 = pauVar36 + 2;
                pauVar38 = pauVar26;
              }
              else {
                lVar27 = 0;
                if (uVar24 != 0) {
                  for (; (uVar24 >> lVar27 & 1) == 0; lVar27 = lVar27 + 1) {
                  }
                }
                auVar45._4_4_ = auVar42._8_4_;
                auVar45._0_4_ = auVar42._8_4_;
                auVar45._8_4_ = auVar42._8_4_;
                auVar45._12_4_ = auVar42._8_4_;
                auVar91 = blendvps(auVar87,auVar71,auVar45);
                auVar112 = blendvps(auVar71,auVar87,auVar45);
                auVar94._8_4_ = *(int *)(local_1118 + lVar27 * 4);
                auVar94._0_8_ = *(undefined8 *)(uVar39 + lVar27 * 8);
                auVar94._12_4_ = 0;
                auVar46._8_4_ = -(uint)(iVar25 < *(int *)(local_1118 + lVar27 * 4));
                auVar46._4_4_ = auVar46._8_4_;
                auVar46._0_4_ = auVar46._8_4_;
                auVar46._12_4_ = auVar46._8_4_;
                auVar89 = blendvps(auVar94,auVar81,auVar46);
                auVar69 = blendvps(auVar81,auVar94,auVar46);
                auVar47._8_4_ = -(uint)(auVar112._8_4_ < auVar69._8_4_);
                auVar47._4_4_ = auVar47._8_4_;
                auVar47._0_4_ = auVar47._8_4_;
                auVar47._12_4_ = auVar47._8_4_;
                auVar95 = blendvps(auVar69,auVar112,auVar47);
                auVar112 = blendvps(auVar112,auVar69,auVar47);
                auVar48._8_4_ = -(uint)(auVar91._8_4_ < auVar89._8_4_);
                auVar48._4_4_ = auVar48._8_4_;
                auVar48._0_4_ = auVar48._8_4_;
                auVar48._12_4_ = auVar48._8_4_;
                auVar69 = blendvps(auVar89,auVar91,auVar48);
                auVar91 = blendvps(auVar91,auVar89,auVar48);
                auVar49._8_4_ = -(uint)(auVar91._8_4_ < auVar95._8_4_);
                auVar49._4_4_ = auVar49._8_4_;
                auVar49._0_4_ = auVar49._8_4_;
                auVar49._12_4_ = auVar49._8_4_;
                auVar89 = blendvps(auVar95,auVar91,auVar49);
                auVar91 = blendvps(auVar91,auVar95,auVar49);
                *pauVar36 = auVar112;
                pauVar36[1] = auVar91;
                pauVar36[2] = auVar89;
                pauVar26 = auVar69._0_8_;
                pauVar36 = pauVar36 + 3;
                pauVar38 = pauVar26;
                fVar109 = local_1138;
                fVar93 = fStack_1134;
                fVar97 = fStack_1130;
                fVar98 = fStack_112c;
                fVar113 = local_1148;
                fVar101 = fStack_1144;
                fVar102 = fStack_1140;
                fVar103 = fStack_113c;
              }
            }
          }
        }
        local_11b8 = (ulong)((uint)pauVar38 & 0xf) - 8;
        uVar39 = (ulong)pauVar38 & 0xfffffffffffffff0;
        for (local_11b0 = 0; local_11b0 != local_11b8; local_11b0 = local_11b0 + 1) {
          lVar27 = local_11b0 * 0x50;
          pSVar33 = context->scene;
          ppfVar14 = (pSVar33->vertices).items;
          pfVar15 = ppfVar14[*(uint *)(uVar39 + 0x30 + lVar27)];
          pfVar9 = pfVar15 + *(uint *)(uVar39 + lVar27);
          pfVar1 = pfVar15 + *(uint *)(uVar39 + 0x10 + lVar27);
          pfVar15 = pfVar15 + *(uint *)(uVar39 + 0x20 + lVar27);
          pfVar16 = ppfVar14[*(uint *)(uVar39 + 0x34 + lVar27)];
          pfVar2 = pfVar16 + *(uint *)(uVar39 + 4 + lVar27);
          pfVar3 = pfVar16 + *(uint *)(uVar39 + 0x14 + lVar27);
          pfVar16 = pfVar16 + *(uint *)(uVar39 + 0x24 + lVar27);
          pfVar17 = ppfVar14[*(uint *)(uVar39 + 0x38 + lVar27)];
          pfVar4 = pfVar17 + *(uint *)(uVar39 + 8 + lVar27);
          pfVar5 = pfVar17 + *(uint *)(uVar39 + 0x18 + lVar27);
          pfVar17 = pfVar17 + *(uint *)(uVar39 + 0x28 + lVar27);
          pfVar18 = ppfVar14[*(uint *)(uVar39 + 0x3c + lVar27)];
          pfVar6 = pfVar18 + *(uint *)(uVar39 + 0xc + lVar27);
          pfVar7 = pfVar18 + *(uint *)(uVar39 + 0x1c + lVar27);
          pfVar8 = pfVar18 + *(uint *)(uVar39 + 0x2c + lVar27);
          puVar10 = (undefined8 *)(uVar39 + 0x30 + lVar27);
          local_f88 = *puVar10;
          uStack_f80 = puVar10[1];
          puVar10 = (undefined8 *)(uVar39 + 0x40 + lVar27);
          local_1128 = *puVar10;
          uStack_1120 = puVar10[1];
          fVar136 = (ray->super_RayK<1>).org.field_0.m128[0];
          fVar86 = (ray->super_RayK<1>).org.field_0.m128[1];
          fVar127 = (ray->super_RayK<1>).org.field_0.m128[2];
          fVar104 = *pfVar9 - fVar136;
          fVar106 = *pfVar2 - fVar136;
          fStack_1220 = *pfVar4 - fVar136;
          fStack_121c = *pfVar6 - fVar136;
          local_fa8 = pfVar9[1] - fVar86;
          fStack_fa4 = pfVar2[1] - fVar86;
          fStack_fa0 = pfVar4[1] - fVar86;
          fStack_f9c = pfVar6[1] - fVar86;
          local_f98 = pfVar9[2] - fVar127;
          fStack_f94 = pfVar2[2] - fVar127;
          fStack_f90 = pfVar4[2] - fVar127;
          fStack_f8c = pfVar6[2] - fVar127;
          fVar93 = *pfVar1 - fVar136;
          fVar97 = *pfVar3 - fVar136;
          fVar98 = *pfVar5 - fVar136;
          fVar109 = *pfVar7 - fVar136;
          fVar66 = pfVar1[1] - fVar86;
          fVar73 = pfVar3[1] - fVar86;
          fVar75 = pfVar5[1] - fVar86;
          fVar77 = pfVar7[1] - fVar86;
          fVar110 = pfVar1[2] - fVar127;
          fVar114 = pfVar3[2] - fVar127;
          fVar117 = pfVar5[2] - fVar127;
          fVar119 = pfVar7[2] - fVar127;
          fVar133 = *pfVar15 - fVar136;
          fVar134 = *pfVar16 - fVar136;
          fVar135 = *pfVar17 - fVar136;
          fVar136 = *pfVar8 - fVar136;
          fVar78 = pfVar15[1] - fVar86;
          fVar84 = pfVar16[1] - fVar86;
          fVar85 = pfVar17[1] - fVar86;
          fVar86 = pfVar8[1] - fVar86;
          fVar121 = pfVar15[2] - fVar127;
          fVar124 = pfVar16[2] - fVar127;
          fVar126 = pfVar17[2] - fVar127;
          fVar127 = pfVar8[2] - fVar127;
          fVar101 = fVar133 - fVar104;
          fVar102 = fVar134 - fVar106;
          fVar103 = fVar135 - fStack_1220;
          fVar113 = fVar136 - fStack_121c;
          local_1228 = (RTCIntersectArguments *)CONCAT44(fVar106,fVar104);
          fVar105 = fVar78 - local_fa8;
          fVar116 = fVar84 - fStack_fa4;
          fVar107 = fVar85 - fStack_fa0;
          fVar108 = fVar86 - fStack_f9c;
          local_fb8 = fVar121 - local_f98;
          fStack_fb4 = fVar124 - fStack_f94;
          fStack_fb0 = fVar126 - fStack_f90;
          fStack_fac = fVar127 - fStack_f8c;
          local_11d8 = fVar105;
          fStack_11d4 = fVar116;
          fStack_11d0 = fVar107;
          fStack_11cc = fVar108;
          local_11c8._4_4_ = fVar102;
          local_11c8._0_4_ = fVar101;
          fStack_11c0 = fVar103;
          fStack_11bc = fVar113;
          fVar65 = (ray->super_RayK<1>).dir.field_0.m128[0];
          local_1238._4_4_ = (ray->super_RayK<1>).dir.field_0.m128[1];
          local_1248._4_4_ = (ray->super_RayK<1>).dir.field_0.m128[2];
          fVar41 = (fVar105 * (fVar121 + local_f98) - local_fb8 * (fVar78 + local_fa8)) * fVar65 +
                   (local_fb8 * (fVar133 + fVar104) - (fVar121 + local_f98) * fVar101) *
                   (float)local_1238._4_4_ +
                   ((fVar78 + local_fa8) * fVar101 - (fVar133 + fVar104) * fVar105) *
                   (float)local_1248._4_4_;
          fVar59 = (fVar116 * (fVar124 + fStack_f94) - fStack_fb4 * (fVar84 + fStack_fa4)) * fVar65
                   + (fStack_fb4 * (fVar134 + fVar106) - (fVar124 + fStack_f94) * fVar102) *
                     (float)local_1238._4_4_ +
                     ((fVar84 + fStack_fa4) * fVar102 - (fVar134 + fVar106) * fVar116) *
                     (float)local_1248._4_4_;
          auVar50._0_8_ = CONCAT44(fVar59,fVar41);
          auVar50._8_4_ =
               (fVar107 * (fVar126 + fStack_f90) - fStack_fb0 * (fVar85 + fStack_fa0)) * fVar65 +
               (fStack_fb0 * (fVar135 + fStack_1220) - (fVar126 + fStack_f90) * fVar103) *
               (float)local_1238._4_4_ +
               ((fVar85 + fStack_fa0) * fVar103 - (fVar135 + fStack_1220) * fVar107) *
               (float)local_1248._4_4_;
          auVar50._12_4_ =
               (fVar108 * (fVar127 + fStack_f8c) - fStack_fac * (fVar86 + fStack_f9c)) * fVar65 +
               (fStack_fac * (fVar136 + fStack_121c) - (fVar127 + fStack_f8c) * fVar113) *
               (float)local_1238._4_4_ +
               ((fVar86 + fStack_f9c) * fVar113 - (fVar136 + fStack_121c) * fVar108) *
               (float)local_1248._4_4_;
          fVar128 = local_fa8 - fVar66;
          fVar130 = fStack_fa4 - fVar73;
          fVar131 = fStack_fa0 - fVar75;
          fVar132 = fStack_f9c - fVar77;
          fVar67 = local_f98 - fVar110;
          fVar74 = fStack_f94 - fVar114;
          fVar76 = fStack_f90 - fVar117;
          fVar123 = fStack_f8c - fVar119;
          fVar137 = fVar104 - fVar93;
          fVar139 = fVar106 - fVar97;
          fVar140 = fStack_1220 - fVar98;
          fVar141 = fStack_121c - fVar109;
          local_fc8 = (fVar128 * (local_f98 + fVar110) - fVar67 * (local_fa8 + fVar66)) * fVar65 +
                      (fVar67 * (fVar104 + fVar93) - (local_f98 + fVar110) * fVar137) *
                      (float)local_1238._4_4_ +
                      ((local_fa8 + fVar66) * fVar137 - (fVar104 + fVar93) * fVar128) *
                      (float)local_1248._4_4_;
          fStack_fc4 = (fVar130 * (fStack_f94 + fVar114) - fVar74 * (fStack_fa4 + fVar73)) * fVar65
                       + (fVar74 * (fVar106 + fVar97) - (fStack_f94 + fVar114) * fVar139) *
                         (float)local_1238._4_4_ +
                         ((fStack_fa4 + fVar73) * fVar139 - (fVar106 + fVar97) * fVar130) *
                         (float)local_1248._4_4_;
          fStack_fc0 = (fVar131 * (fStack_f90 + fVar117) - fVar76 * (fStack_fa0 + fVar75)) * fVar65
                       + (fVar76 * (fStack_1220 + fVar98) - (fStack_f90 + fVar117) * fVar140) *
                         (float)local_1238._4_4_ +
                         ((fStack_fa0 + fVar75) * fVar140 - (fStack_1220 + fVar98) * fVar131) *
                         (float)local_1248._4_4_;
          fStack_fbc = (fVar132 * (fStack_f8c + fVar119) - fVar123 * (fStack_f9c + fVar77)) * fVar65
                       + (fVar123 * (fStack_121c + fVar109) - (fStack_f8c + fVar119) * fVar141) *
                         (float)local_1238._4_4_ +
                         ((fStack_f9c + fVar77) * fVar141 - (fStack_121c + fVar109) * fVar132) *
                         (float)local_1248._4_4_;
          local_fd8._0_4_ = fVar93 - fVar133;
          local_fd8._4_4_ = fVar97 - fVar134;
          local_fd8._8_4_ = fVar98 - fVar135;
          local_fd8._12_4_ = fVar109 - fVar136;
          local_11d8 = fVar66 - fVar78;
          fStack_11d4 = fVar73 - fVar84;
          fStack_11d0 = fVar75 - fVar85;
          fStack_11cc = fVar77 - fVar86;
          fVar125 = fVar110 - fVar121;
          fVar115 = fVar114 - fVar124;
          fVar118 = fVar117 - fVar126;
          fVar120 = fVar119 - fVar127;
          local_1248._0_4_ = local_1248._4_4_;
          fStack_1240 = (float)local_1248._4_4_;
          fStack_123c = (float)local_1248._4_4_;
          local_1238._0_4_ = local_1238._4_4_;
          fStack_1230 = (float)local_1238._4_4_;
          fStack_122c = (float)local_1238._4_4_;
          local_1218._8_4_ = auVar50._8_4_;
          local_1218._0_8_ = auVar50._0_8_;
          local_1218._12_4_ = auVar50._12_4_;
          auVar72._0_4_ =
               (local_11d8 * (fVar121 + fVar110) - fVar125 * (fVar78 + fVar66)) * fVar65 +
               (fVar125 * (fVar133 + fVar93) - (fVar121 + fVar110) * local_fd8._0_4_) *
               (float)local_1238._4_4_ +
               ((fVar78 + fVar66) * local_fd8._0_4_ - (fVar133 + fVar93) * local_11d8) *
               (float)local_1248._4_4_;
          auVar72._4_4_ =
               (fStack_11d4 * (fVar124 + fVar114) - fVar115 * (fVar84 + fVar73)) * fVar65 +
               (fVar115 * (fVar134 + fVar97) - (fVar124 + fVar114) * local_fd8._4_4_) *
               (float)local_1238._4_4_ +
               ((fVar84 + fVar73) * local_fd8._4_4_ - (fVar134 + fVar97) * fStack_11d4) *
               (float)local_1248._4_4_;
          auVar72._8_4_ =
               (fStack_11d0 * (fVar126 + fVar117) - fVar118 * (fVar85 + fVar75)) * fVar65 +
               (fVar118 * (fVar135 + fVar98) - (fVar126 + fVar117) * local_fd8._8_4_) *
               (float)local_1238._4_4_ +
               ((fVar85 + fVar75) * local_fd8._8_4_ - (fVar135 + fVar98) * fStack_11d0) *
               (float)local_1248._4_4_;
          auVar72._12_4_ =
               (fStack_11cc * (fVar127 + fVar119) - fVar120 * (fVar86 + fVar77)) * fVar65 +
               (fVar120 * (fVar136 + fVar109) - (fVar127 + fVar119) * local_fd8._12_4_) *
               (float)local_1238._4_4_ +
               ((fVar86 + fVar77) * local_fd8._12_4_ - (fVar136 + fVar109) * fStack_11cc) *
               (float)local_1248._4_4_;
          local_11c8._0_4_ = fVar41 + local_fc8 + auVar72._0_4_;
          local_11c8._4_4_ = fVar59 + fStack_fc4 + auVar72._4_4_;
          fStack_11c0 = auVar50._8_4_ + fStack_fc0 + auVar72._8_4_;
          fStack_11bc = auVar50._12_4_ + fStack_fbc + auVar72._12_4_;
          auVar21._4_4_ = fStack_fc4;
          auVar21._0_4_ = local_fc8;
          auVar21._8_4_ = fStack_fc0;
          auVar21._12_4_ = fStack_fbc;
          auVar112 = minps(auVar50,auVar21);
          auVar112 = minps(auVar112,auVar72);
          auVar22._4_4_ = fStack_fc4;
          auVar22._0_4_ = local_fc8;
          auVar22._8_4_ = fStack_fc0;
          auVar22._12_4_ = fStack_fbc;
          auVar111 = maxps(local_1218,auVar22);
          auVar111 = maxps(auVar111,auVar72);
          fVar136 = ABS((float)local_11c8._0_4_) * 1.1920929e-07;
          fVar86 = ABS((float)local_11c8._4_4_) * 1.1920929e-07;
          fVar127 = ABS(fStack_11c0) * 1.1920929e-07;
          fVar66 = ABS(fStack_11bc) * 1.1920929e-07;
          local_1269 = 0;
          auVar99._0_4_ =
               -(uint)(auVar111._0_4_ <= fVar136 || -fVar136 <= auVar112._0_4_) & local_1068;
          auVar99._4_4_ =
               -(uint)(auVar111._4_4_ <= fVar86 || -fVar86 <= auVar112._4_4_) & uStack_1064;
          auVar99._8_4_ =
               -(uint)(auVar111._8_4_ <= fVar127 || -fVar127 <= auVar112._8_4_) & uStack_1060;
          auVar99._12_4_ =
               -(uint)(auVar111._12_4_ <= fVar66 || -fVar66 <= auVar112._12_4_) & uStack_105c;
          iVar25 = movmskps((int)lVar27,auVar99);
          if (iVar25 != 0) {
            auVar129._0_4_ = fVar128 * fVar125 - fVar67 * local_11d8;
            auVar129._4_4_ = fVar130 * fVar115 - fVar74 * fStack_11d4;
            auVar129._8_4_ = fVar131 * fVar118 - fVar76 * fStack_11d0;
            auVar129._12_4_ = fVar132 * fVar120 - fVar123 * fStack_11cc;
            auVar51._4_4_ = -(uint)(ABS(fStack_fb4 * fVar130) < ABS(fVar74 * fStack_11d4));
            auVar51._0_4_ = -(uint)(ABS(local_fb8 * fVar128) < ABS(fVar67 * local_11d8));
            auVar51._8_4_ = -(uint)(ABS(fStack_fb0 * fVar131) < ABS(fVar76 * fStack_11d0));
            auVar51._12_4_ = -(uint)(ABS(fStack_fac * fVar132) < ABS(fVar123 * fStack_11cc));
            auVar20._4_4_ = fVar116 * fVar74 - fStack_fb4 * fVar130;
            auVar20._0_4_ = fVar105 * fVar67 - local_fb8 * fVar128;
            auVar20._8_4_ = fVar107 * fVar76 - fStack_fb0 * fVar131;
            auVar20._12_4_ = fVar108 * fVar123 - fStack_fac * fVar132;
            local_1098 = blendvps(auVar129,auVar20,auVar51);
            auVar96._0_4_ = fVar67 * local_fd8._0_4_ - fVar137 * fVar125;
            auVar96._4_4_ = fVar74 * local_fd8._4_4_ - fVar139 * fVar115;
            auVar96._8_4_ = fVar76 * local_fd8._8_4_ - fVar140 * fVar118;
            auVar96._12_4_ = fVar123 * local_fd8._12_4_ - fVar141 * fVar120;
            auVar52._4_4_ = -(uint)(ABS(fVar102 * fVar74) < ABS(fVar139 * fVar115));
            auVar52._0_4_ = -(uint)(ABS(fVar101 * fVar67) < ABS(fVar137 * fVar125));
            auVar52._8_4_ = -(uint)(ABS(fVar103 * fVar76) < ABS(fVar140 * fVar118));
            auVar52._12_4_ = -(uint)(ABS(fVar113 * fVar123) < ABS(fVar141 * fVar120));
            auVar23._4_4_ = fStack_fb4 * fVar139 - fVar102 * fVar74;
            auVar23._0_4_ = local_fb8 * fVar137 - fVar101 * fVar67;
            auVar23._8_4_ = fStack_fb0 * fVar140 - fVar103 * fVar76;
            auVar23._12_4_ = fStack_fac * fVar141 - fVar113 * fVar123;
            local_1088 = blendvps(auVar96,auVar23,auVar52);
            auVar92._0_4_ = fVar101 * fVar128 - fVar105 * fVar137;
            auVar92._4_4_ = fVar102 * fVar130 - fVar116 * fVar139;
            auVar92._8_4_ = fVar103 * fVar131 - fVar107 * fVar140;
            auVar92._12_4_ = fVar113 * fVar132 - fVar108 * fVar141;
            auVar138._0_4_ = fVar137 * local_11d8 - fVar128 * local_fd8._0_4_;
            auVar138._4_4_ = fVar139 * fStack_11d4 - fVar130 * local_fd8._4_4_;
            auVar138._8_4_ = fVar140 * fStack_11d0 - fVar131 * local_fd8._8_4_;
            auVar138._12_4_ = fVar141 * fStack_11cc - fVar132 * local_fd8._12_4_;
            auVar53._4_4_ = -(uint)(ABS(fVar116 * fVar139) < ABS(fVar130 * local_fd8._4_4_));
            auVar53._0_4_ = -(uint)(ABS(fVar105 * fVar137) < ABS(fVar128 * local_fd8._0_4_));
            auVar53._8_4_ = -(uint)(ABS(fVar107 * fVar140) < ABS(fVar131 * local_fd8._8_4_));
            auVar53._12_4_ = -(uint)(ABS(fVar108 * fVar141) < ABS(fVar132 * local_fd8._12_4_));
            local_1078 = blendvps(auVar138,auVar92,auVar53);
            fVar136 = fVar65 * local_1098._0_4_ +
                      (float)local_1238._4_4_ * local_1088._0_4_ +
                      (float)local_1248._4_4_ * local_1078._0_4_;
            fVar86 = fVar65 * local_1098._4_4_ +
                     (float)local_1238._4_4_ * local_1088._4_4_ +
                     (float)local_1248._4_4_ * local_1078._4_4_;
            fVar127 = fVar65 * local_1098._8_4_ +
                      (float)local_1238._4_4_ * local_1088._8_4_ +
                      (float)local_1248._4_4_ * local_1078._8_4_;
            fVar65 = fVar65 * local_1098._12_4_ +
                     (float)local_1238._4_4_ * local_1088._12_4_ +
                     (float)local_1248._4_4_ * local_1078._12_4_;
            auVar60._0_4_ = fVar136 + fVar136;
            auVar60._4_4_ = fVar86 + fVar86;
            auVar60._8_4_ = fVar127 + fVar127;
            auVar60._12_4_ = fVar65 + fVar65;
            auVar54._0_4_ = local_f98 * local_1078._0_4_;
            auVar54._4_4_ = fStack_f94 * local_1078._4_4_;
            auVar54._8_4_ = fStack_f90 * local_1078._8_4_;
            auVar54._12_4_ = fStack_f8c * local_1078._12_4_;
            fVar66 = fVar104 * local_1098._0_4_ + local_fa8 * local_1088._0_4_ + auVar54._0_4_;
            fVar67 = fVar106 * local_1098._4_4_ + fStack_fa4 * local_1088._4_4_ + auVar54._4_4_;
            fVar73 = fStack_1220 * local_1098._8_4_ + fStack_fa0 * local_1088._8_4_ + auVar54._8_4_;
            fVar74 = fStack_121c * local_1098._12_4_ +
                     fStack_f9c * local_1088._12_4_ + auVar54._12_4_;
            auVar112 = rcpps(auVar54,auVar60);
            fVar136 = auVar112._0_4_;
            fVar86 = auVar112._4_4_;
            fVar127 = auVar112._8_4_;
            fVar65 = auVar112._12_4_;
            local_1238._0_4_ =
                 ((1.0 - auVar60._0_4_ * fVar136) * fVar136 + fVar136) * (fVar66 + fVar66);
            local_1238._4_4_ =
                 ((1.0 - auVar60._4_4_ * fVar86) * fVar86 + fVar86) * (fVar67 + fVar67);
            fStack_1230 = ((1.0 - auVar60._8_4_ * fVar127) * fVar127 + fVar127) * (fVar73 + fVar73);
            fStack_122c = ((1.0 - auVar60._12_4_ * fVar65) * fVar65 + fVar65) * (fVar74 + fVar74);
            local_1248._0_4_ = (ray->super_RayK<1>).tfar;
            local_1248._4_4_ = (ray->super_RayK<1>).mask;
            fStack_1240 = (float)(ray->super_RayK<1>).id;
            fStack_123c = (float)(ray->super_RayK<1>).flags;
            fVar136 = (ray->super_RayK<1>).org.field_0.m128[3];
            auVar55._4_4_ = -(uint)(fVar136 <= (float)local_1238._4_4_);
            auVar55._0_4_ = -(uint)(fVar136 <= (float)local_1238._0_4_);
            auVar55._8_4_ = -(uint)(fVar136 <= fStack_1230);
            auVar55._12_4_ = -(uint)(fVar136 <= fStack_122c);
            auVar61._0_4_ =
                 (int)((uint)(auVar60._0_4_ != 0.0 &&
                             ((float)local_1238._0_4_ <= (float)local_1248._0_4_ &&
                             fVar136 <= (float)local_1238._0_4_)) * -0x80000000) >> 0x1f;
            auVar61._4_4_ =
                 (int)((uint)(auVar60._4_4_ != 0.0 &&
                             ((float)local_1238._4_4_ <= (float)local_1248._0_4_ &&
                             fVar136 <= (float)local_1238._4_4_)) * -0x80000000) >> 0x1f;
            auVar61._8_4_ =
                 (int)((uint)(auVar60._8_4_ != 0.0 &&
                             (fStack_1230 <= (float)local_1248._0_4_ && fVar136 <= fStack_1230)) *
                      -0x80000000) >> 0x1f;
            auVar61._12_4_ =
                 (int)((uint)(auVar60._12_4_ != 0.0 &&
                             (fStack_122c <= (float)local_1248._0_4_ && fVar136 <= fStack_122c)) *
                      -0x80000000) >> 0x1f;
            auVar62 = auVar61 & auVar99;
            iVar25 = movmskps(iVar25,auVar62);
            if (iVar25 != 0) {
              local_1118._8_4_ = auVar50._8_4_;
              local_1118._0_8_ = auVar50._0_8_;
              fStack_110c = auVar50._12_4_;
              local_1108 = local_fc8;
              fStack_1104 = fStack_fc4;
              fStack_1100 = fStack_fc0;
              fStack_10fc = fStack_fbc;
              local_10f8 = _local_11c8;
              local_10e8 = &local_1269;
              local_10d8 = auVar62;
              local_10a8 = _local_1238;
              local_1208 = auVar62;
              auVar112 = rcpps(auVar55,_local_11c8);
              fVar136 = auVar112._0_4_;
              fVar86 = auVar112._4_4_;
              fVar127 = auVar112._8_4_;
              fVar65 = auVar112._12_4_;
              fVar136 = (float)(-(uint)(1e-18 <= ABS((float)local_11c8._0_4_)) &
                               (uint)(((float)DAT_01f46a60 - (float)local_11c8._0_4_ * fVar136) *
                                      fVar136 + fVar136));
              fVar86 = (float)(-(uint)(1e-18 <= ABS((float)local_11c8._4_4_)) &
                              (uint)((DAT_01f46a60._4_4_ - (float)local_11c8._4_4_ * fVar86) *
                                     fVar86 + fVar86));
              fVar127 = (float)(-(uint)(1e-18 <= ABS(fStack_11c0)) &
                               (uint)((DAT_01f46a60._8_4_ - fStack_11c0 * fVar127) * fVar127 +
                                     fVar127));
              fVar65 = (float)(-(uint)(1e-18 <= ABS(fStack_11bc)) &
                              (uint)((DAT_01f46a60._12_4_ - fStack_11bc * fVar65) * fVar65 + fVar65)
                              );
              auVar100._0_4_ = fVar41 * fVar136;
              auVar100._4_4_ = fVar59 * fVar86;
              auVar100._8_4_ = auVar50._8_4_ * fVar127;
              auVar100._12_4_ = auVar50._12_4_ * fVar65;
              local_10c8 = minps(auVar100,_DAT_01f46a60);
              auVar122._0_4_ = fVar136 * local_fc8;
              auVar122._4_4_ = fVar86 * fStack_fc4;
              auVar122._8_4_ = fVar127 * fStack_fc0;
              auVar122._12_4_ = fVar65 * fStack_fbc;
              local_10b8 = minps(auVar122,_DAT_01f46a60);
              auVar111 = blendvps(_DAT_01f45a30,_local_1238,auVar62);
              auVar82._4_4_ = auVar111._0_4_;
              auVar82._0_4_ = auVar111._4_4_;
              auVar82._8_4_ = auVar111._12_4_;
              auVar82._12_4_ = auVar111._8_4_;
              auVar112 = minps(auVar82,auVar111);
              auVar56._0_8_ = auVar112._8_8_;
              auVar56._8_4_ = auVar112._0_4_;
              auVar56._12_4_ = auVar112._4_4_;
              auVar112 = minps(auVar56,auVar112);
              auVar57._0_8_ =
                   CONCAT44(-(uint)(auVar112._4_4_ == auVar111._4_4_) & auVar62._4_4_,
                            -(uint)(auVar112._0_4_ == auVar111._0_4_) & auVar62._0_4_);
              auVar57._8_4_ = -(uint)(auVar112._8_4_ == auVar111._8_4_) & auVar62._8_4_;
              auVar57._12_4_ = -(uint)(auVar112._12_4_ == auVar111._12_4_) & auVar62._12_4_;
              iVar25 = movmskps((int)&local_1269,auVar57);
              if (iVar25 != 0) {
                auVar62._8_4_ = auVar57._8_4_;
                auVar62._0_8_ = auVar57._0_8_;
                auVar62._12_4_ = auVar57._12_4_;
              }
              uVar28 = extractps(_local_1248,1);
              uVar29 = movmskps((int)pfVar18,auVar62);
              uVar32 = CONCAT44((int)((ulong)pfVar18 >> 0x20),uVar29);
              lVar27 = 0;
              local_1258 = pSVar33;
              if (uVar32 != 0) {
                for (; (uVar32 >> lVar27 & 1) == 0; lVar27 = lVar27 + 1) {
                }
              }
LAB_00684119:
              local_1160 = *(uint *)((long)&local_f88 + lVar27 * 4);
              pRVar30 = (RTCIntersectArguments *)(ulong)local_1160;
              pGVar19 = (pSVar33->geometries).items[(long)pRVar30].ptr;
              if ((pGVar19->mask & (uint)uVar28) == 0) {
                *(undefined4 *)(local_1208 + lVar27 * 4) = 0;
              }
              else {
                local_1228 = context->args;
                if (local_1228->filter == (RTCFilterFunctionN)0x0) {
                  local_11a8.context = context->user;
                  if (pGVar19->intersectionFilterN == (RTCFilterFunctionN)0x0) {
                    fVar136 = *(float *)(local_10c8 + lVar27 * 4);
                    fVar86 = *(float *)(local_10b8 + lVar27 * 4);
                    (ray->super_RayK<1>).tfar = *(float *)(local_10a8 + lVar27 * 4);
                    (ray->Ng).field_0.field_0.x = *(float *)(local_1098 + lVar27 * 4);
                    (ray->Ng).field_0.field_0.y = *(float *)(local_1088 + lVar27 * 4);
                    (ray->Ng).field_0.field_0.z = *(float *)(local_1078 + lVar27 * 4);
                    ray->u = fVar136;
                    ray->v = fVar86;
                    ray->primID = *(uint *)((long)&local_1128 + lVar27 * 4);
                    ray->geomID = local_1160;
                    ray->instID[0] = (local_11a8.context)->instID[0];
                    ray->instPrimID[0] = (local_11a8.context)->instPrimID[0];
                    goto LAB_0068444f;
                  }
                }
                else {
                  local_11a8.context = context->user;
                }
                local_1178 = *(float *)(local_1098 + lVar27 * 4);
                local_1174 = *(undefined4 *)(local_1088 + lVar27 * 4);
                local_1170 = *(undefined4 *)(local_1078 + lVar27 * 4);
                local_116c = *(undefined4 *)(local_10c8 + lVar27 * 4);
                local_1168 = *(undefined4 *)(local_10b8 + lVar27 * 4);
                local_1164 = *(undefined4 *)((long)&local_1128 + lVar27 * 4);
                local_115c = (local_11a8.context)->instID[0];
                local_1158 = (local_11a8.context)->instPrimID[0];
                (ray->super_RayK<1>).tfar = *(float *)(local_10a8 + lVar27 * 4);
                local_124c = -1;
                local_11a8.valid = &local_124c;
                pRVar30 = (RTCIntersectArguments *)pGVar19->userPtr;
                local_11a8.geometryUserPtr = pRVar30;
                local_11a8.ray = (RTCRayN *)ray;
                local_11a8.hit = (RTCHitN *)&local_1178;
                local_11a8.N = 1;
                local_1218._0_8_ = pGVar19;
                if (((pGVar19->intersectionFilterN == (RTCFilterFunctionN)0x0) ||
                    ((*pGVar19->intersectionFilterN)(&local_11a8), pSVar33 = local_1258,
                    uVar34 = local_1268, context = local_11e0, ray = local_11e8, uVar35 = local_11f0
                    , *local_11a8.valid != 0)) &&
                   ((local_1228->filter == (RTCFilterFunctionN)0x0 ||
                    (((pRVar30 = local_1228,
                      (local_1228->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) ==
                      RTC_RAY_QUERY_FLAG_INCOHERENT &&
                      (pRVar30 = (RTCIntersectArguments *)local_1218._0_8_,
                      ((ulong)((RTCIntersectArguments *)(local_1218._0_8_ + 0x20))->intersect &
                      0x40000000000000) == 0)) ||
                     ((*local_1228->filter)(&local_11a8), pSVar33 = local_1258, uVar34 = local_1268,
                     context = local_11e0, ray = local_11e8, uVar35 = local_11f0,
                     *local_11a8.valid != 0)))))) {
                  (((Vec3f *)((long)local_11a8.ray + 0x30))->field_0).field_0.x =
                       *(float *)local_11a8.hit;
                  (((Vec3f *)((long)local_11a8.ray + 0x30))->field_0).field_0.y =
                       *(float *)(local_11a8.hit + 4);
                  (((Vec3f *)((long)local_11a8.ray + 0x30))->field_0).field_0.z =
                       *(float *)(local_11a8.hit + 8);
                  *(float *)((long)local_11a8.ray + 0x3c) = *(float *)(local_11a8.hit + 0xc);
                  *(float *)((long)local_11a8.ray + 0x40) = *(float *)(local_11a8.hit + 0x10);
                  *(float *)((long)local_11a8.ray + 0x44) = *(float *)(local_11a8.hit + 0x14);
                  *(float *)((long)local_11a8.ray + 0x48) = *(float *)(local_11a8.hit + 0x18);
                  *(float *)((long)local_11a8.ray + 0x4c) = *(float *)(local_11a8.hit + 0x1c);
                  pRVar30 = (RTCIntersectArguments *)(ulong)(uint)*(float *)(local_11a8.hit + 0x20);
                  *(float *)((long)local_11a8.ray + 0x50) = *(float *)(local_11a8.hit + 0x20);
                }
                else {
                  (local_11e8->super_RayK<1>).tfar = (float)local_1248._0_4_;
                  pSVar33 = local_1258;
                  uVar34 = local_1268;
                  context = local_11e0;
                  ray = local_11e8;
                  uVar35 = local_11f0;
                }
                *(undefined4 *)(local_1208 + lVar27 * 4) = 0;
                local_1248._0_4_ = (ray->super_RayK<1>).tfar;
                local_1248._4_4_ = (ray->super_RayK<1>).mask;
                fStack_1240 = (float)(ray->super_RayK<1>).id;
                fStack_123c = (float)(ray->super_RayK<1>).flags;
                local_1208._0_4_ =
                     -(uint)(local_1238._0_4_ <= (float)local_1248._0_4_) & local_1208._0_4_;
                local_1208._4_4_ =
                     -(uint)(local_1238._4_4_ <= (float)local_1248._0_4_) & local_1208._4_4_;
                local_1208._8_4_ =
                     -(uint)(local_1238._8_4_ <= (float)local_1248._0_4_) & local_1208._8_4_;
                local_1208._12_4_ =
                     -(uint)(local_1238._12_4_ <= (float)local_1248._0_4_) & local_1208._12_4_;
                uVar28 = extractps(_local_1248,1);
              }
              iVar25 = movmskps((int)pRVar30,local_1208);
              if (iVar25 == 0) goto LAB_0068444f;
              auVar111 = blendvps(_DAT_01f45a30,_local_1238,local_1208);
              auVar83._4_4_ = auVar111._0_4_;
              auVar83._0_4_ = auVar111._4_4_;
              auVar83._8_4_ = auVar111._12_4_;
              auVar83._12_4_ = auVar111._8_4_;
              auVar112 = minps(auVar83,auVar111);
              auVar63._0_8_ = auVar112._8_8_;
              auVar63._8_4_ = auVar112._0_4_;
              auVar63._12_4_ = auVar112._4_4_;
              auVar112 = minps(auVar63,auVar112);
              auVar64._0_8_ =
                   CONCAT44(-(uint)(auVar112._4_4_ == auVar111._4_4_) & local_1208._4_4_,
                            -(uint)(auVar112._0_4_ == auVar111._0_4_) & local_1208._0_4_);
              auVar64._8_4_ = -(uint)(auVar112._8_4_ == auVar111._8_4_) & local_1208._8_4_;
              auVar64._12_4_ = -(uint)(auVar112._12_4_ == auVar111._12_4_) & local_1208._12_4_;
              iVar25 = movmskps(iVar25,auVar64);
              auVar58 = local_1208;
              if (iVar25 != 0) {
                auVar58._8_4_ = auVar64._8_4_;
                auVar58._0_8_ = auVar64._0_8_;
                auVar58._12_4_ = auVar64._12_4_;
              }
              uVar29 = movmskps(iVar25,auVar58);
              uVar32 = CONCAT44((int)((ulong)pRVar30 >> 0x20),uVar29);
              lVar27 = 0;
              if (uVar32 != 0) {
                for (; (uVar32 >> lVar27 & 1) == 0; lVar27 = lVar27 + 1) {
                }
              }
              goto LAB_00684119;
            }
          }
LAB_0068444f:
          uVar32 = local_1260;
          fVar41 = local_fe8;
          fVar86 = fStack_fe4;
          fVar59 = fStack_fe0;
          fVar66 = fStack_fdc;
          fVar136 = local_ff8;
          fVar67 = fStack_ff4;
          fVar73 = fStack_ff0;
          fVar74 = fStack_fec;
          fVar65 = local_1038;
          fVar75 = fStack_1034;
          fVar76 = fStack_1030;
          fVar77 = fStack_102c;
          fVar123 = local_1058;
          fVar78 = fStack_1054;
          fVar84 = fStack_1050;
          fVar85 = fStack_104c;
          fVar109 = local_1138;
          fVar93 = fStack_1134;
          fVar97 = fStack_1130;
          fVar98 = fStack_112c;
          fVar113 = local_1148;
          fVar101 = fStack_1144;
          fVar102 = fStack_1140;
          fVar103 = fStack_113c;
          fVar116 = local_1008;
          fVar104 = fStack_1004;
          fVar105 = fStack_1000;
          fVar106 = fStack_ffc;
          fVar125 = local_1018;
          fVar107 = fStack_1014;
          fVar108 = fStack_1010;
          fVar110 = fStack_100c;
          fVar127 = local_1028;
          fVar114 = fStack_1024;
          fVar115 = fStack_1020;
          fVar117 = fStack_101c;
          fVar121 = local_1048;
          fVar118 = fStack_1044;
          fVar119 = fStack_1040;
          fVar120 = fStack_103c;
        }
        fVar124 = (ray->super_RayK<1>).tfar;
        auVar111._4_4_ = fVar124;
        auVar111._0_4_ = fVar124;
        auVar111._8_4_ = fVar124;
        auVar111._12_4_ = fVar124;
      }
      goto LAB_00683834;
    }
  }
  return;
}

Assistant:

void BVHNIntersector1<N, types, robust, PrimitiveIntersector1>::intersect(const Accel::Intersectors* __restrict__ This,
                                                                              RayHit& __restrict__ ray,
                                                                              RayQueryContext* __restrict__ context)
    {
      const BVH* __restrict__ bvh = (const BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
      
      /* perform per ray precalculations required by the primitive intersector */
      Precalculations pre(ray, bvh);

      /* stack state */
      StackItemT<NodeRef> stack[stackSize];    // stack of nodes
      StackItemT<NodeRef>* stackPtr = stack+1; // current stack pointer
      StackItemT<NodeRef>* stackEnd = stack+stackSize;
      stack[0].ptr  = bvh->root;
      stack[0].dist = neg_inf;
      
      if (bvh->root == BVH::emptyNode)
        return;
      
      /* filter out invalid rays */
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      if (!ray.valid()) return;
#endif
      /* verify correct input */
      assert(ray.valid());
      assert(ray.tnear() >= 0.0f);
      assert(!(types & BVH_MB) || (ray.time() >= 0.0f && ray.time() <= 1.0f));

      /* load the ray into SIMD registers */
      TravRay<N,robust> tray(ray.org, ray.dir, max(ray.tnear(), 0.0f), max(ray.tfar, 0.0f));

      /* initialize the node traverser */
      BVHNNodeTraverser1Hit<N, types> nodeTraverser;

      /* pop loop */
      while (true) pop:
      {
        /* pop next node */
        if (unlikely(stackPtr == stack)) break;
        stackPtr--;
        NodeRef cur = NodeRef(stackPtr->ptr);

        /* if popped node is too far, pop next one */
        if (unlikely(*(float*)&stackPtr->dist > ray.tfar))
          continue;

        /* downtraversal loop */
        while (true)
        {
          /* intersect node */
          size_t mask; vfloat<N> tNear;
          STAT3(normal.trav_nodes,1,1,1);
          bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray, ray.time(), tNear, mask);
          if (unlikely(!nodeIntersected)) { STAT3(normal.trav_nodes,-1,-1,-1); break; }

          /* if no child is hit, pop next node */
          if (unlikely(mask == 0))
            goto pop;

          /* select next child and push other children */
          nodeTraverser.traverseClosestHit(cur, mask, tNear, stackPtr, stackEnd);
        }

        /* this is a leaf node */
        assert(cur != BVH::emptyNode);
        STAT3(normal.trav_leaves,1,1,1);
        size_t num; Primitive* prim = (Primitive*)cur.leaf(num);
        size_t lazy_node = 0;
        PrimitiveIntersector1::intersect(This, pre, ray, context, prim, num, tray, lazy_node);
        tray.tfar = ray.tfar;

        /* push lazy node onto stack */
        if (unlikely(lazy_node)) {
          stackPtr->ptr = lazy_node;
          stackPtr->dist = neg_inf;
          stackPtr++;
        }
      }
    }